

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

ostream * smf::operator<<(ostream *out,MidiMessage *message)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  size_type sVar3;
  byte *pbVar4;
  ostream *poVar5;
  int local_1c;
  int i;
  MidiMessage *message_local;
  ostream *out_local;
  
  local_1c = 0;
  while( true ) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    if ((int)sVar3 <= local_1c) break;
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (long)local_1c);
    if (*pbVar4 < 0x80) {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          (long)local_1c);
      std::ostream::operator<<(out,(uint)*pbVar4);
    }
    else {
      poVar5 = std::operator<<(out,"0x");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
      _Var2 = std::setw(2);
      poVar5 = std::operator<<(poVar5,_Var2);
      _Var1 = std::setfill<char>('0');
      poVar5 = std::operator<<(poVar5,_Var1._M_c);
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          (long)local_1c);
      std::ostream::operator<<(poVar5,(uint)*pbVar4);
      poVar5 = (ostream *)std::ostream::operator<<(out,std::dec);
      _Var2 = std::setw(0);
      poVar5 = std::operator<<(poVar5,_Var2);
      _Var1 = std::setfill<char>(' ');
      std::operator<<(poVar5,_Var1._M_c);
    }
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    if (local_1c < (int)sVar3 + -1) {
      std::operator<<(out,' ');
    }
    local_1c = local_1c + 1;
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, MidiMessage& message) {
	for (int i=0; i<(int)message.size(); i++) {
		if (message[i] >= 0x80) {
			out << "0x" << std::hex << std::setw(2) << std::setfill('0') << (int)message[i];
			out << std::dec << std::setw(0) << std::setfill(' ');
		} else {
			out << (int)message[i];
		}
		if (i<(int)message.size() - 1) {
			out << ' ';
		}
	}
	return out;
}